

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O0

ion_status_t sl_get(ion_skiplist_t *skiplist,ion_key_t key,ion_value_t value)

{
  ion_key_size_t iVar1;
  int iVar2;
  ion_status_t iVar3;
  char cVar4;
  ion_sl_node_t *piVar5;
  ion_sl_node_t *cursor;
  ion_value_size_t value_size;
  ion_key_size_t key_size;
  ion_value_t value_local;
  ion_key_t key_local;
  ion_skiplist_t *skiplist_local;
  
  iVar1 = (skiplist->super).record.key_size;
  iVar2 = (skiplist->super).record.value_size;
  piVar5 = sl_find_node(skiplist,key);
  if (piVar5->key != (ion_key_t)0x0) {
    cVar4 = (*(skiplist->super).compare)(piVar5->key,key,iVar1);
    if (cVar4 == '\0') {
      memcpy(value,piVar5->value,(long)iVar2);
      skiplist_local._0_4_ = (uint)skiplist_local._1_3_ << 8;
      skiplist_local._4_4_ = 1;
      goto LAB_00108141;
    }
  }
  skiplist_local._0_4_ = CONCAT31(skiplist_local._1_3_,1);
  skiplist_local._4_4_ = 0;
LAB_00108141:
  iVar3.count = skiplist_local._4_4_;
  iVar3._0_4_ = (int)skiplist_local;
  return iVar3;
}

Assistant:

ion_status_t
sl_get(
	ion_skiplist_t	*skiplist,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_key_size_t		key_size	= skiplist->super.record.key_size;
	ion_value_size_t	value_size	= skiplist->super.record.value_size;
	ion_sl_node_t		*cursor		= sl_find_node(skiplist, key);

	if ((NULL == cursor->key) || (skiplist->super.compare(cursor->key, key, key_size) != 0)) {
		return ION_STATUS_ERROR(err_item_not_found);
	}

	memcpy(value, cursor->value, value_size);

	return ION_STATUS_OK(1);
}